

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Reduce_scatter_block
              (void *sendbuf,void *recvbuf,int recvcount,MPIABI_Datatype datatype,MPIABI_Op op,
              MPIABI_Comm comm)

{
  int iVar1;
  ompi_datatype_t *poVar2;
  ompi_op_t *poVar3;
  ompi_communicator_t *poVar4;
  WPI_Handle<ompi_communicator_t_*> local_50;
  WPI_Handle<ompi_op_t_*> local_48;
  WPI_Handle<ompi_datatype_t_*> local_40;
  MPIABI_Comm local_38;
  MPIABI_Comm comm_local;
  MPIABI_Op op_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_18;
  int recvcount_local;
  void *recvbuf_local;
  void *sendbuf_local;
  
  local_38 = comm;
  comm_local = op;
  op_local = datatype;
  datatype_local._4_4_ = recvcount;
  pvStack_18 = recvbuf;
  recvbuf_local = sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle(&local_40,datatype);
  poVar2 = WPI_Handle::operator_cast_to_ompi_datatype_t_((WPI_Handle *)&local_40);
  WPI_Handle<ompi_op_t_*>::WPI_Handle(&local_48,comm_local);
  poVar3 = WPI_Handle::operator_cast_to_ompi_op_t_((WPI_Handle *)&local_48);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_50,local_38);
  poVar4 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_50);
  iVar1 = MPI_Reduce_scatter_block(sendbuf,recvbuf,recvcount,poVar2,poVar3,poVar4);
  return iVar1;
}

Assistant:

int MPIABI_Reduce_scatter_block(
  const void * sendbuf,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype datatype,
  MPIABI_Op op,
  MPIABI_Comm comm
) {
  return MPI_Reduce_scatter_block(
    sendbuf,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)datatype,
    (MPI_Op)(WPI_Op)op,
    (MPI_Comm)(WPI_Comm)comm
  );
}